

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_disk_set_standard_lookup.c
# Opt level: O0

int64_t lookup_uid(void *private_data,char *uname,int64_t uid)

{
  int iVar1;
  char *pcVar2;
  ulong in_RDX;
  char *in_RSI;
  long in_RDI;
  int r;
  passwd *result;
  passwd pwent;
  char *allocated;
  char *buffer;
  size_t bufsize;
  char _buffer [128];
  bucket *ucache;
  bucket *b;
  int h;
  passwd *local_108;
  passwd local_100;
  char *local_d0;
  char *local_c8;
  size_t local_c0;
  char local_b8 [128];
  long local_38;
  long *local_30;
  uint local_24;
  ulong local_20;
  char *local_18;
  ulong local_8;
  
  local_8 = in_RDX;
  if ((in_RSI != (char *)0x0) && (*in_RSI != '\0')) {
    local_38 = in_RDI;
    local_20 = in_RDX;
    local_18 = in_RSI;
    local_24 = hash(in_RSI);
    local_30 = (long *)(local_38 + ((ulong)(long)(int)local_24 % 0x7f) * 0x10);
    if ((*local_30 == 0) ||
       ((*(uint *)(local_30 + 1) != local_24 ||
        (iVar1 = strcmp(local_18,(char *)*local_30), iVar1 != 0)))) {
      if (*local_30 != 0) {
        free((void *)*local_30);
      }
      pcVar2 = strdup(local_18);
      *local_30 = (long)pcVar2;
      *(uint *)(local_30 + 1) = local_24;
      local_c0 = 0x80;
      local_d0 = (char *)0x0;
      pcVar2 = local_b8;
      do {
        local_c8 = pcVar2;
        local_108 = &local_100;
        iVar1 = getpwnam_r(local_18,&local_100,local_c8,local_c0,&local_108);
        if ((iVar1 == 0) || (iVar1 != 0x22)) break;
        local_c0 = local_c0 << 1;
        free(local_d0);
        local_d0 = (char *)malloc(local_c0);
        pcVar2 = local_d0;
      } while (local_d0 != (char *)0x0);
      if (local_108 != (passwd *)0x0) {
        local_20 = (ulong)local_108->pw_uid;
      }
      free(local_d0);
      *(int *)((long)local_30 + 0xc) = (int)local_20;
      local_8 = local_20;
    }
    else {
      local_8 = (ulong)*(uint *)((long)local_30 + 0xc);
    }
  }
  return local_8;
}

Assistant:

static int64_t
lookup_uid(void *private_data, const char *uname, int64_t uid)
{
	int h;
	struct bucket *b;
	struct bucket *ucache = (struct bucket *)private_data;

	/* If no uname, just use the uid provided. */
	if (uname == NULL || *uname == '\0')
		return (uid);

	/* Try to find uname in the cache. */
	h = hash(uname);
	b = &ucache[h % cache_size ];
	if (b->name != NULL && b->hash == h && strcmp(uname, b->name) == 0)
		return ((uid_t)b->id);

	/* Free the cache slot for a new entry. */
	if (b->name != NULL)
		free(b->name);
	b->name = strdup(uname);
	/* Note: If strdup fails, that's okay; we just won't cache. */
	b->hash = h;
#if HAVE_PWD_H
#  if HAVE_GETPWNAM_R
	{
		char _buffer[128];
		size_t bufsize = 128;
		char *buffer = _buffer;
		char *allocated = NULL;
		struct passwd	pwent, *result;
		int r;

		for (;;) {
			result = &pwent; /* Old getpwnam_r ignores last arg. */
			r = getpwnam_r(uname, &pwent, buffer, bufsize, &result);
			if (r == 0)
				break;
			if (r != ERANGE)
				break;
			bufsize *= 2;
			free(allocated);
			allocated = malloc(bufsize);
			if (allocated == NULL)
				break;
			buffer = allocated;
		}
		if (result != NULL)
			uid = result->pw_uid;
		free(allocated);
	}
#  else /* HAVE_GETPWNAM_R */
	{
		struct passwd *result;

		result = getpwnam(uname);
		if (result != NULL)
			uid = result->pw_uid;
	}
#endif	/* HAVE_GETPWNAM_R */
#elif defined(_WIN32) && !defined(__CYGWIN__)
	/* TODO: do a uname->uid lookup for Windows. */
#else
	#error No way to look up uids on this platform
#endif
	b->id = (uid_t)uid;

	return (uid);
}